

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeavyRowGenerator.cpp
# Opt level: O2

bool __thiscall OffsetCauchyMatrixParams::Initialize(OffsetCauchyMatrixParams *this,uint64_t seed)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  PCGRandom local_28;
  
  bVar3 = false;
  local_28.State = 0;
  local_28.Inc = 0;
  siamese::PCGRandom::Seed(&local_28,seed,0);
  uVar1 = (uint)(local_28.State >> 0x2d) ^ (uint)(local_28.State >> 0x1b);
  bVar2 = (byte)(local_28.State >> 0x3b);
  uVar1 = (uVar1 >> bVar2 | uVar1 << 0x20 - bVar2) & 0xff;
  this->Rows = uVar1 + 1;
  if (4 < uVar1) {
    this->Cols = uVar1 ^ 0xff;
    if ((uVar1 ^ 0xff) < 0x12) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      this->RowWiggle = uVar1 - 5;
      this->ColWiggle = 0xed - uVar1;
    }
  }
  return bVar3;
}

Assistant:

bool Initialize(const uint64_t seed)
    {
        PCGRandom prng;
        prng.Seed(seed);

        Rows = (prng.Next() % 256) + 1;
        if (Rows < kRows) {
            return false;
        }
        Cols = 256 - Rows;
        if (Cols < kColumns) {
            return false;
        }

        RowWiggle = Rows - kRows;
        ColWiggle = Cols - kColumns;
        // We could add a random offset here too but not needed to find a solution.
        return true;
    }